

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitTagDeclarationAsSpecifier
          (DeclarationBinder *this,TagDeclarationAsSpecifierSyntax *node)

{
  Action AVar1;
  SyntaxKind SVar2;
  TagDeclarationSyntax *pTVar3;
  Identifier *pIVar4;
  ostream *poVar5;
  SyntaxToken local_e8;
  SyntaxToken local_b0;
  SyntaxToken local_68;
  Type *local_30;
  TagType *tagTy;
  TagTypeSpecifierSyntax *tySpec;
  TagDeclarationAsSpecifierSyntax *node_local;
  DeclarationBinder *this_local;
  
  tySpec = (TagTypeSpecifierSyntax *)node;
  node_local = (TagDeclarationAsSpecifierSyntax *)this;
  pTVar3 = TagDeclarationAsSpecifierSyntax::tagDeclaration(node);
  AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,(SyntaxNode *)pTVar3);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    pTVar3 = TagDeclarationAsSpecifierSyntax::tagDeclaration
                       ((TagDeclarationAsSpecifierSyntax *)tySpec);
    tagTy = (TagType *)TagDeclarationSyntax::typeSpecifier(pTVar3);
    local_30 = (Type *)0x0;
    SVar2 = C::SyntaxNode::kind((SyntaxNode *)tagTy);
    if (SVar2 == StructTypeSpecifier) {
      TagTypeSpecifierSyntax::tagToken(&local_68,(TagTypeSpecifierSyntax *)tagTy);
      pIVar4 = obtainKnownTag(this,&local_68);
      local_30 = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                            (this,Struct,pIVar4)->super_Type;
      SyntaxToken::~SyntaxToken(&local_68);
    }
    else if (SVar2 == UnionTypeSpecifier) {
      TagTypeSpecifierSyntax::tagToken(&local_b0,(TagTypeSpecifierSyntax *)tagTy);
      pIVar4 = obtainKnownTag(this,&local_b0);
      local_30 = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                            (this,Union,pIVar4)->super_Type;
      SyntaxToken::~SyntaxToken(&local_b0);
    }
    else {
      if (SVar2 != EnumTypeSpecifier) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e0);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,"<empty message>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        return Quit;
      }
      TagTypeSpecifierSyntax::tagToken(&local_e8,(TagTypeSpecifierSyntax *)tagTy);
      pIVar4 = obtainKnownTag(this,&local_e8);
      local_30 = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                            (this,Enum,pIVar4)->super_Type;
      SyntaxToken::~SyntaxToken(&local_e8);
    }
    pushType(this,local_30);
    this_local._7_1_ = Skip;
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitTagDeclarationAsSpecifier(
        const TagDeclarationAsSpecifierSyntax* node)
{
    VISIT(node->tagDeclaration());

    const TagTypeSpecifierSyntax* tySpec = node->tagDeclaration()->typeSpecifier();
    TagType* tagTy = nullptr;
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::UnionTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::EnumTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Enum,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
    pushType(tagTy);

    return Action::Skip;
}